

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
llvm::cl::parser<unsigned_long_long>::parse
          (parser<unsigned_long_long> *this,Option *O,StringRef ArgName,StringRef Arg,
          unsigned_long_long *Value)

{
  Option *this_00;
  type tVar1;
  raw_ostream *Errs;
  StringRef local_98;
  Twine local_88;
  Twine local_70;
  Twine local_58;
  Option *local_40;
  Option *O_local;
  parser<unsigned_long_long> *this_local;
  StringRef Arg_local;
  StringRef ArgName_local;
  
  Arg_local.Data = (char *)Arg.Length;
  this_local = (parser<unsigned_long_long> *)Arg.Data;
  Arg_local.Length = (size_t)ArgName.Data;
  local_40 = O;
  O_local = (Option *)this;
  tVar1 = StringRef::getAsInteger<unsigned_long_long>((StringRef *)&this_local,0,Value);
  this_00 = local_40;
  if (tVar1) {
    llvm::operator+(&local_70,"\'",(StringRef *)&this_local);
    Twine::Twine(&local_88,"\' value invalid for uint argument!");
    llvm::operator+(&local_58,&local_70,&local_88);
    memset(&local_98,0,0x10);
    StringRef::StringRef(&local_98);
    Errs = errs();
    ArgName_local.Length._7_1_ = Option::error(this_00,&local_58,local_98,Errs);
  }
  else {
    ArgName_local.Length._7_1_ = false;
  }
  return ArgName_local.Length._7_1_;
}

Assistant:

bool parser<unsigned long long>::parse(Option &O, StringRef ArgName,
                                       StringRef Arg,
                                       unsigned long long &Value) {

  if (Arg.getAsInteger(0, Value))
    return O.error("'" + Arg + "' value invalid for uint argument!");
  return false;
}